

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O2

void __thiscall
WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::WaitTillDone(WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *this)

{
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  
  while ((*(int *)(this + 0xac) != 0 || (*(long *)(this + 0xe0) != *(long *)(this + 0xc0)))) {
    local_20.__r = 0x32;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
  }
  return;
}

Assistant:

void WaitTillDone() {
    while( !Done() ) {
      std::this_thread::sleep_for( std::chrono::milliseconds( 50 ) );
    }
  }